

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  int iVar1;
  long lVar2;
  TestCase *this_00;
  Random *pRVar3;
  size_type sVar4;
  reference ppTVar5;
  long in_FS_OFFSET;
  ulong local_20;
  size_t i;
  UnitTestImpl *this_local;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar3 = (Random *)random(this);
  ShuffleRange<int>(pRVar3,0,this->last_death_test_case_ + 1,&this->test_case_indices_);
  pRVar3 = (Random *)random(this);
  iVar1 = this->last_death_test_case_;
  sVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                    (&this->test_cases_);
  ShuffleRange<int>(pRVar3,iVar1 + 1,(int)sVar4,&this->test_case_indices_);
  local_20 = 0;
  while( true ) {
    sVar4 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                      (&this->test_cases_);
    if (sVar4 <= local_20) break;
    ppTVar5 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&this->test_cases_,local_20);
    this_00 = *ppTVar5;
    pRVar3 = (Random *)random(this);
    TestCase::ShuffleTests(this_00,pRVar3);
    local_20 = local_20 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test cases.
  ShuffleRange(random(), 0, last_death_test_case_ + 1, &test_case_indices_);

  // Shuffles the non-death test cases.
  ShuffleRange(random(), last_death_test_case_ + 1,
               static_cast<int>(test_cases_.size()), &test_case_indices_);

  // Shuffles the tests inside each test case.
  for (size_t i = 0; i < test_cases_.size(); i++) {
    test_cases_[i]->ShuffleTests(random());
  }
}